

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O3

void ndn_lite_default_aes_load_backend(void)

{
  ndn_aes_backend_t *pnVar1;
  
  pnVar1 = ndn_aes_get_backend();
  pnVar1->get_key_size = ndn_lite_default_aes_get_key_size;
  pnVar1->get_key_value = ndn_lite_default_aes_get_key_value;
  pnVar1->load_key = ndn_lite_default_aes_load_key;
  pnVar1->cbc_encrypt = ndn_lite_default_aes_cbc_encrypt;
  pnVar1->cbc_decrypt = ndn_lite_default_aes_cbc_decrypt;
  pnVar1->probe_padding_size = ndn_lite_default_aes_probe_padding_size;
  pnVar1->parse_unpadding_size = ndn_lite_default_aes_parse_unpadding_size;
  return;
}

Assistant:

void
ndn_lite_default_aes_load_backend(void)
{
  ndn_aes_backend_t* backend = ndn_aes_get_backend();
  backend->get_key_size = ndn_lite_default_aes_get_key_size;
  backend->get_key_value = ndn_lite_default_aes_get_key_value;
  backend->load_key = ndn_lite_default_aes_load_key;
  backend->cbc_encrypt = ndn_lite_default_aes_cbc_encrypt;
  backend->cbc_decrypt = ndn_lite_default_aes_cbc_decrypt;
  backend->probe_padding_size = ndn_lite_default_aes_probe_padding_size;
  backend->parse_unpadding_size = ndn_lite_default_aes_parse_unpadding_size;
}